

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_functions.cpp
# Opt level: O2

bool ml_two_byte_SHIFT_JIS(char *p,char *head)

{
  for (; head < p;
      head = head + (ulong)((byte)(*head + 0x20U) < 0x1d || (byte)(*head + 0x7fU) < 0x1f) + 1) {
  }
  if (head != p) {
    return false;
  }
  return (byte)(*head + 0x20U) < 0x1d || (byte)(*head + 0x7fU) < 0x1f;
}

Assistant:

bool
ml_two_byte_SHIFT_JIS(const char *p, const char *head)
{
  int x;

  while (head < p) {
    x = (*head) & 0xFF;
    if (FBSJIS(x))
      head += 2;
    else
      head++;
  }
  if (head == p) {
    x = (*head) & 0xFF;
    return (FBSJIS(x));
  }
  return (false);
}